

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

MockSpec<void_(SDL_Texture_*)> * __thiscall
testing::internal::FunctionMocker<void_(SDL_Texture_*)>::With
          (MockSpec<void_(SDL_Texture_*)> *__return_storage_ptr__,
          FunctionMocker<void_(SDL_Texture_*)> *this,Matcher<SDL_Texture_*> *m)

{
  SharedPayloadBase *pSVar1;
  MatcherBase<SDL_Texture_*> local_20;
  
  local_20.vtable_ = (m->super_MatcherBase<SDL_Texture_*>).vtable_;
  local_20.buffer_ = (m->super_MatcherBase<SDL_Texture_*>).buffer_;
  (m->super_MatcherBase<SDL_Texture_*>).vtable_ = (VTable *)0x0;
  local_20.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0032e258;
  __return_storage_ptr__->function_mocker_ = this;
  (__return_storage_ptr__->matchers_).super__Tuple_impl<0UL,_testing::Matcher<SDL_Texture_*>_>.
  super__Head_base<0UL,_testing::Matcher<SDL_Texture_*>,_false>._M_head_impl.
  super_MatcherBase<SDL_Texture_*>.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0032e2c8;
  (__return_storage_ptr__->matchers_).super__Tuple_impl<0UL,_testing::Matcher<SDL_Texture_*>_>.
  super__Head_base<0UL,_testing::Matcher<SDL_Texture_*>,_false>._M_head_impl.
  super_MatcherBase<SDL_Texture_*>.vtable_ = local_20.vtable_;
  (__return_storage_ptr__->matchers_).super__Tuple_impl<0UL,_testing::Matcher<SDL_Texture_*>_>.
  super__Head_base<0UL,_testing::Matcher<SDL_Texture_*>,_false>._M_head_impl.
  super_MatcherBase<SDL_Texture_*>.buffer_ = local_20.buffer_;
  if ((local_20.vtable_ != (VTable *)0x0) &&
     ((local_20.vtable_)->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    pSVar1 = (__return_storage_ptr__->matchers_).
             super__Tuple_impl<0UL,_testing::Matcher<SDL_Texture_*>_>.
             super__Head_base<0UL,_testing::Matcher<SDL_Texture_*>,_false>._M_head_impl.
             super_MatcherBase<SDL_Texture_*>.buffer_.shared;
    LOCK();
    (pSVar1->ref).super___atomic_base<int>._M_i = (pSVar1->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (__return_storage_ptr__->matchers_).super__Tuple_impl<0UL,_testing::Matcher<SDL_Texture_*>_>.
  super__Head_base<0UL,_testing::Matcher<SDL_Texture_*>,_false>._M_head_impl.
  super_MatcherBase<SDL_Texture_*>.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0032e258;
  MatcherBase<SDL_Texture_*>::~MatcherBase(&local_20);
  return __return_storage_ptr__;
}

Assistant:

MockSpec<F> With(Matcher<Args>... m) {
    return MockSpec<F>(this, ::std::make_tuple(std::move(m)...));
  }